

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadSectors(MapData *map,FMissingTextureTracker *missingtex)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  sector_t_conflict *__s;
  ulong *puVar9;
  secplane_t *psVar10;
  extsector_t *peVar11;
  ulong uVar12;
  bool bVar13;
  extsector_t *local_d0;
  sector_t_conflict *local_98;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_78;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_74;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_70;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_6c;
  FTextureID local_68 [5];
  DWORD local_54;
  FDynamicColormap *pFStack_50;
  int lumplen;
  FDynamicColormap *normMap;
  FDynamicColormap *fogMap;
  sector_t_conflict *psStack_38;
  int defSeqType;
  sector_t_conflict *ss;
  mapsector_t *ms;
  char *msp;
  FMissingTextureTracker *pFStack_18;
  int i;
  FMissingTextureTracker *missingtex_local;
  MapData *map_local;
  
  pFStack_18 = missingtex;
  missingtex_local = (FMissingTextureTracker *)map;
  local_54 = MapData::Size(map,8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_54;
  numsectors = SUB164(auVar1 / ZEXT816(0x1a),0);
  uVar7 = (ulong)numsectors;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(0x218),0);
  if (SUB168(auVar2 * ZEXT816(0x218),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  __s = (sector_t_conflict *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_98 = __s;
    do {
      sector_t::sector_t((sector_t *)local_98);
      local_98 = local_98 + 1;
    } while (local_98 != __s + uVar7);
  }
  sectors = __s;
  memset(__s,0,(long)numsectors * 0x218);
  if ((level.flags & 0x1000) == 0) {
    fogMap._4_4_ = 0xffffffff;
  }
  else {
    fogMap._4_4_ = 0;
  }
  pFStack_50 = (FDynamicColormap *)0x0;
  normMap = (FDynamicColormap *)0x0;
  ms = (mapsector_t *)operator_new__((long)(int)local_54);
  MapData::Read((MapData *)missingtex_local,8,ms,-1);
  ss = (sector_t_conflict *)ms;
  psStack_38 = sectors;
  uVar7 = (ulong)numsectors;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar8 = SUB168(auVar3 * ZEXT816(0xa0),0);
  uVar12 = uVar8 + 8;
  if (SUB168(auVar3 * ZEXT816(0xa0),8) != 0 || 0xfffffffffffffff7 < uVar8) {
    uVar12 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar12);
  *puVar9 = uVar7;
  peVar11 = (extsector_t *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_d0 = peVar11;
    do {
      extsector_t::extsector_t(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != peVar11 + uVar7);
  }
  sectors->e = peVar11;
  for (msp._4_4_ = 0; msp._4_4_ < numsectors; msp._4_4_ = msp._4_4_ + 1) {
    psStack_38->e = sectors->e + msp._4_4_;
    if ((missingtex_local[8].Size & 1) == 0) {
      psStack_38->Flags = psStack_38->Flags | 4;
    }
    sector_t::SetPlaneTexZ
              ((sector_t *)psStack_38,0,(double)(int)*(short *)&ss->planes[0].xform.xOffs);
    psVar10 = &psStack_38->floorplane;
    dVar4 = sector_t::GetPlaneTexZ((sector_t *)psStack_38,0);
    secplane_t::set(psVar10,0.0,0.0,1.0,-dVar4);
    sector_t::SetPlaneTexZ
              ((sector_t *)psStack_38,1,
               (double)(int)*(short *)((long)&ss->planes[0].xform.xOffs + 2));
    psVar10 = &psStack_38->ceilingplane;
    dVar4 = sector_t::GetPlaneTexZ((sector_t *)psStack_38,1);
    secplane_t::set(psVar10,0.0,0.0,-1.0,dVar4);
    SetTexture(psStack_38,msp._4_4_,0,(char *)((long)&ss->planes[0].xform.xOffs + 4),pFStack_18,true
              );
    SetTexture(psStack_38,msp._4_4_,1,(char *)((long)&ss->planes[0].xform.yOffs + 4),pFStack_18,true
              );
    psStack_38->lightlevel = *(short *)((long)&ss->planes[0].xform.baseyOffs + 4);
    if ((missingtex_local[8].Size & 1) == 0) {
      iVar6 = P_TranslateSectorSpecial((int)*(short *)((long)&ss->planes[0].xform.baseyOffs + 6));
      psStack_38->special = (short)iVar6;
    }
    else {
      psStack_38->special = *(short *)((long)&ss->planes[0].xform.baseyOffs + 6);
    }
    FTagManager::AddSectorTag(&tagManager,msp._4_4_,(int)*(short *)&ss->planes[0].xform.xScale);
    psStack_38->thinglist = (AActor *)0x0;
    psStack_38->touching_thinglist = (msecnode_t *)0x0;
    psStack_38->render_thinglist = (msecnode_t *)0x0;
    psStack_38->touching_renderthings = (msecnode_t *)0x0;
    psStack_38->seqType = (short)fogMap._4_4_;
    FNameNoInit::operator=(&psStack_38->SeqName,NAME_None);
    psStack_38->nextsec = -1;
    psStack_38->prevsec = -1;
    sector_t::SetAlpha((sector_t *)psStack_38,0,1.0);
    sector_t::SetAlpha((sector_t *)psStack_38,1,1.0);
    sector_t::SetXScale((sector_t *)psStack_38,0,1.0);
    sector_t::SetYScale((sector_t *)psStack_38,0,1.0);
    sector_t::SetXScale((sector_t *)psStack_38,1,1.0);
    sector_t::SetYScale((sector_t *)psStack_38,1,1.0);
    psStack_38->heightsec = (sector_t_conflict *)0x0;
    psStack_38->gravity = 1.0;
    psStack_38->ZoneNumber = 0xffff;
    psStack_38->terrainnum[0] = -1;
    psStack_38->terrainnum[1] = -1;
    bVar13 = false;
    if (level.outsidefog != 0xff000000) {
      local_68[0] = sector_t::GetTexture((sector_t *)psStack_38,1);
      bVar5 = FTextureID::operator==(local_68,&skyflatnum);
      bVar13 = true;
      if (!bVar5) {
        bVar13 = (psStack_38->special & 0xffU) == 0x57;
      }
    }
    if (bVar13) {
      if (normMap == (FDynamicColormap *)0x0) {
        PalEntry::PalEntry((PalEntry *)&local_6c.field_0,0xff,0xff,0xff);
        PalEntry::PalEntry((PalEntry *)&local_70.field_0,level.outsidefog);
        normMap = GetSpecialLights((PalEntry)local_6c.field_0,(PalEntry)local_70.field_0,0);
      }
      psStack_38->ColorMap = normMap;
    }
    else {
      if (pFStack_50 == (FDynamicColormap *)0x0) {
        PalEntry::PalEntry((PalEntry *)&local_74.field_0,0xff,0xff,0xff);
        PalEntry::PalEntry((PalEntry *)&local_78.field_0,level.fadeto);
        pFStack_50 = GetSpecialLights((PalEntry)local_74.field_0,(PalEntry)local_78.field_0,
                                      NormalLight.Desaturate);
      }
      psStack_38->ColorMap = pFStack_50;
    }
    psStack_38->friction = 0.90625;
    psStack_38->movefactor = 0.03125;
    psStack_38->sectornum = msp._4_4_;
    psStack_38 = psStack_38 + 1;
    ss = (sector_t_conflict *)((long)&ss->planes[0].xform.xScale + 2);
  }
  if (ms != (mapsector_t *)0x0) {
    operator_delete__(ms);
  }
  return;
}

Assistant:

void P_LoadSectors (MapData *map, FMissingTextureTracker &missingtex)
{
	int 				i;
	char				*msp;
	mapsector_t			*ms;
	sector_t*			ss;
	int					defSeqType;
	FDynamicColormap	*fogMap, *normMap;
	int					lumplen = map->Size(ML_SECTORS);

	numsectors = lumplen / sizeof(mapsector_t);
	sectors = new sector_t[numsectors];		
	memset (sectors, 0, numsectors*sizeof(sector_t));

	if (level.flags & LEVEL_SNDSEQTOTALCTRL)
		defSeqType = 0;
	else
		defSeqType = -1;

	fogMap = normMap = NULL;

	msp = new char[lumplen];
	map->Read(ML_SECTORS, msp);
	ms = (mapsector_t*)msp;
	ss = sectors;
	
	// Extended properties
	sectors[0].e = new extsector_t[numsectors];

	for (i = 0; i < numsectors; i++, ss++, ms++)
	{
		ss->e = &sectors[0].e[i];
		if (!map->HasBehavior) ss->Flags |= SECF_FLOORDROP;
		ss->SetPlaneTexZ(sector_t::floor, (double)LittleShort(ms->floorheight));
		ss->floorplane.set(0, 0, 1., -ss->GetPlaneTexZ(sector_t::floor));
		ss->SetPlaneTexZ(sector_t::ceiling, (double)LittleShort(ms->ceilingheight));
		ss->ceilingplane.set(0, 0, -1., ss->GetPlaneTexZ(sector_t::ceiling));
		SetTexture(ss, i, sector_t::floor, ms->floorpic, missingtex, true);
		SetTexture(ss, i, sector_t::ceiling, ms->ceilingpic, missingtex, true);
		ss->lightlevel = LittleShort(ms->lightlevel);
		if (map->HasBehavior)
			ss->special = LittleShort(ms->special);
		else	// [RH] Translate to new sector special
			ss->special = P_TranslateSectorSpecial (LittleShort(ms->special));
		tagManager.AddSectorTag(i, LittleShort(ms->tag));
		ss->thinglist = nullptr;
		ss->touching_thinglist = nullptr;		// phares 3/14/98
		ss->render_thinglist = nullptr;
		ss->touching_renderthings = nullptr;
		ss->seqType = defSeqType;
		ss->SeqName = NAME_None;
		ss->nextsec = -1;	//jff 2/26/98 add fields to support locking out
		ss->prevsec = -1;	// stair retriggering until build completes

		ss->SetAlpha(sector_t::floor, 1.);
		ss->SetAlpha(sector_t::ceiling, 1.);
		ss->SetXScale(sector_t::floor, 1.);	// [RH] floor and ceiling scaling
		ss->SetYScale(sector_t::floor, 1.);
		ss->SetXScale(sector_t::ceiling, 1.);
		ss->SetYScale(sector_t::ceiling, 1.);

		ss->heightsec = NULL;	// sector used to get floor and ceiling height
		// killough 3/7/98: end changes

		ss->gravity = 1.f;	// [RH] Default sector gravity of 1.0
		ss->ZoneNumber = 0xFFFF;
		ss->terrainnum[sector_t::ceiling] = ss->terrainnum[sector_t::floor] = -1;

		// [RH] Sectors default to white light with the default fade.
		//		If they are outside (have a sky ceiling), they use the outside fog.
		if (level.outsidefog != 0xff000000 && (ss->GetTexture(sector_t::ceiling) == skyflatnum || (ss->special&0xff) == Sector_Outside))
		{
			if (fogMap == NULL)
				fogMap = GetSpecialLights (PalEntry (255,255,255), level.outsidefog, 0);
			ss->ColorMap = fogMap;
		}
		else
		{
			if (normMap == NULL)
				normMap = GetSpecialLights (PalEntry (255,255,255), level.fadeto, NormalLight.Desaturate);
			ss->ColorMap = normMap;
		}

		// killough 8/28/98: initialize all sectors to normal friction
		ss->friction = ORIG_FRICTION;
		ss->movefactor = ORIG_FRICTION_FACTOR;
		ss->sectornum = i;
	}
	delete[] msp;
}